

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_encoding.cpp
# Opt level: O2

void ximu::PacketEncoding::rightShiftBytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *v)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  pointer puVar4;
  byte bVar5;
  
  puVar4 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  pbVar1 = puVar4 + -1;
  *pbVar1 = *pbVar1 >> 1;
  for (uVar3 = ((int)puVar4 - iVar2) - 2; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    puVar4 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    bVar5 = puVar4[uVar3];
    if ((bVar5 & 1) != 0) {
      puVar4[(ulong)uVar3 + 1] = puVar4[(ulong)uVar3 + 1] | 0x80;
      puVar4 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar5 = puVar4[uVar3];
    }
    puVar4[uVar3] = bVar5 >> 1;
  }
  return;
}

Assistant:

void PacketEncoding::rightShiftBytes(std::vector<unsigned char>& v) {
  size_t size = v.size();
  v[size - 1] >>= 1;

  for (int idx = size - 2; idx >= 0; --idx) {
    if ((v[idx] & 0x01) == 0x01)
      v[idx + 1] |= 0x80;
    v[idx] >>= 1;
  }
}